

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_operations.cpp
# Opt level: O0

void Am_To_Top(Am_Object *object)

{
  bool bVar1;
  unsigned_short uVar2;
  uint uVar3;
  Am_Wrapper *pAVar4;
  Am_Value *pAVar5;
  Am_Ptr ptr;
  Am_Drawonable *pAVar6;
  ostream *poVar7;
  Am_Drawonable *draw;
  Am_Slot local_58;
  Am_Object local_50;
  Am_Object current;
  undefined1 local_40 [4];
  int rank;
  Am_Value_List components;
  Am_Object local_18;
  Am_Object owner;
  Am_Object *object_local;
  
  owner.data = (Am_Object_Data *)object;
  bVar1 = Am_Object::Valid(object);
  if (!bVar1) {
    Am_Error("** Am_To_Top called with (0L) object\n");
  }
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)object);
  bVar1 = Am_Object::Valid(&local_18);
  if (bVar1) {
    Am_Object::Am_Object((Am_Object *)&components.item,&Am_Graphical_Object);
    bVar1 = Am_Object::Is_Instance_Of(object,(Am_Object *)&components.item);
    Am_Object::~Am_Object((Am_Object *)&components.item);
    if (bVar1) {
      Am_Object::Make_Unique(&local_18,0x82);
      Am_Value_List::Am_Value_List((Am_Value_List *)local_40);
      pAVar5 = Am_Object::Get(&local_18,0x82,0);
      Am_Value_List::operator=((Am_Value_List *)local_40,pAVar5);
      pAVar5 = Am_Object::Get(object,0x85,0);
      current.data._4_4_ = Am_Value::operator_cast_to_int(pAVar5);
      uVar3 = current.data._4_4_ + 1;
      uVar2 = Am_Value_List::Length((Am_Value_List *)local_40);
      if (uVar3 != uVar2) {
        Am_Value_List::Start((Am_Value_List *)local_40);
        pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(object);
        Am_Value_List::Member((Am_Value_List *)local_40,pAVar4);
        Am_Value_List::Delete((Am_Value_List *)local_40,false);
        Am_Value_List::Next((Am_Value_List *)local_40);
        Am_Object::Am_Object(&local_50);
        while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_40), ((bVar1 ^ 0xffU) & 1) != 0) {
          pAVar5 = Am_Value_List::Get((Am_Value_List *)local_40);
          Am_Object::operator=(&local_50,pAVar5);
          Am_Object::Set(&local_50,0x85,current.data._4_4_,0);
          current.data._4_4_ = current.data._4_4_ + 1;
          Am_Value_List::Next((Am_Value_List *)local_40);
        }
        uVar2 = Am_Value_List::Length((Am_Value_List *)local_40);
        Am_Object::Set(object,0x85,(uint)uVar2,0);
        pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(object);
        Am_Value_List::Add((Am_Value_List *)local_40,pAVar4,Am_TAIL,false);
        Am_Object::Note_Changed(&local_18,0x82);
        local_58 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)object,0x69);
        Am_Demon_Queue::Enqueue(&Main_Demon_Queue,graphics_repaint,0,&local_58);
        Am_Object::~Am_Object(&local_50);
      }
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_40);
    }
    else {
      Am_Object::Am_Object((Am_Object *)&draw,&Am_Window);
      bVar1 = Am_Object::Is_Instance_Of(object,(Am_Object *)&draw);
      Am_Object::~Am_Object((Am_Object *)&draw);
      if (!bVar1) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"** Am_To_Top: Attempt to raise ");
        poVar7 = operator<<(poVar7,object);
        poVar7 = std::operator<<(poVar7," which is not a graphical object or window");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        Am_Error();
      }
      pAVar5 = Am_Object::Get(object,0x7d2,0);
      ptr = Am_Value::operator_cast_to_void_(pAVar5);
      pAVar6 = Am_Drawonable::Narrow(ptr);
      if (pAVar6 != (Am_Drawonable *)0x0) {
        (*pAVar6->_vptr_Am_Drawonable[5])(pAVar6,0);
      }
    }
  }
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

void
Am_To_Top(Am_Object object)
{
  if (!object.Valid())
    Am_Error("** Am_To_Top called with (0L) object\n");
  Am_Object owner = object.Get_Owner();
  if (!owner.Valid())
    return;
  if (object.Is_Instance_Of(Am_Graphical_Object)) {
    owner.Make_Unique(Am_GRAPHICAL_PARTS);
    Am_Value_List components;
    components = owner.Get(Am_GRAPHICAL_PARTS);
    int rank = object.Get(Am_RANK);
    if (rank + 1 != components.Length()) {
      components.Start();
      components.Member(object);
      components.Delete(false);
      components.Next();
      Am_Object current;
      while (!components.Last()) {
        current = components.Get();
        current.Set(Am_RANK, rank);
        ++rank;
        components.Next();
      }
      object.Set(Am_RANK, (int)components.Length());
      components.Add(object, Am_TAIL, false);
      owner.Note_Changed(Am_GRAPHICAL_PARTS);
      Main_Demon_Queue.Enqueue(
          graphics_repaint, 0,
          ((Am_Object_Advanced &)object).Get_Slot(Am_VISIBLE));
    }
  } else if (object.Is_Instance_Of(Am_Window)) {
    Am_Drawonable *draw = Am_Drawonable::Narrow(object.Get(Am_DRAWONABLE));
    if (draw)
      draw->Raise_Window(nullptr);
  } else {
    std::cerr << "** Am_To_Top: Attempt to raise " << object
              << " which is not "
                 "a graphical object or window"
              << std::endl;
    Am_Error();
  }
}